

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
fmt::v5::internal::vformat<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__)

{
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *buf;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> local_7f8;
  
  local_7f8.super_basic_buffer<wchar_t>.ptr_ = local_7f8.store_;
  local_7f8.super_basic_buffer<wchar_t>.size_ = 0;
  local_7f8.super_basic_buffer<wchar_t>._vptr_basic_buffer = (_func_int **)&PTR_grow_0016bd00;
  local_7f8.super_basic_buffer<wchar_t>.capacity_ = 500;
  vformat_to<wchar_t>(&local_7f8);
  to_string<wchar_t,500ul>(__return_storage_ptr__,(v5 *)&local_7f8,buf);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer(&local_7f8);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return fmt::to_string(buffer);
}